

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermNode * __thiscall
glslang::TParseContext::executeInitializer
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *initializer,TVariable *variable)

{
  EShSource EVar1;
  TIntermediate *pTVar2;
  TSymbolTable *pTVar3;
  TString name;
  TString name_00;
  TString structName;
  TString structName_00;
  char cVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TIntermTyped *pTVar13;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TSmallArrayVector *pTVar14;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_21;
  TType *pTVar15;
  pool_allocator<char> pVar16;
  pool_allocator<char> pVar17;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  TQualifier *pTVar18;
  undefined4 extraout_var_35;
  TIntermSymbol *left;
  TIntermTyped *pTVar19;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  char *pcVar20;
  char *pcVar21;
  int d;
  _func_int **pp_Var22;
  TParseContext *this_01;
  undefined4 in_stack_fffffffffffffe00;
  allocator_type in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe28;
  size_type in_stack_fffffffffffffe30;
  TString local_1b8;
  TString local_190;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_168 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_140 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_118 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f0 [40];
  TType skeletalType;
  undefined4 extraout_var_22;
  
  iVar6 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  if ((CONCAT44(extraout_var,iVar6) == 0) ||
     (iVar6 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer),
     *(int *)(CONCAT44(extraout_var_00,iVar6) + 0xb8) != 0)) {
    bVar5 = false;
  }
  else {
    iVar6 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
    lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 400))
                       ((long *)CONCAT44(extraout_var_01,iVar6));
    bVar5 = *(long *)(lVar12 + 0x10) == *(long *)(lVar12 + 8);
  }
  iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x58))
                     ((long *)CONCAT44(extraout_var_02,iVar6));
  uVar7 = *(uint *)(lVar12 + 8) & 0x7f;
  if (uVar7 < 3) {
LAB_00423853:
    if (!bVar5) {
LAB_004239ac:
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      arrayObjectCheck(this,loc,(TType *)CONCAT44(extraout_var_07,iVar6),"array initializer");
      iVar6 = 1;
      TType::TType(&skeletalType,EbtVoid,EvqTemporary,1,0,0,false);
      iVar8 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      TType::shallowCopy(&skeletalType,(TType *)CONCAT44(extraout_var_08,iVar8));
      TQualifier::makeTemporary(&skeletalType.qualifier);
      pTVar13 = convertInitializerList(this,loc,&skeletalType,initializer);
      if (pTVar13 == (TIntermTyped *)0x0) {
        if (uVar7 != 2) {
          return (TIntermNode *)0x0;
        }
        iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
        pTVar18 = (TQualifier *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar6) + 0x50))
                            ((long *)CONCAT44(extraout_var_23,iVar6));
        TQualifier::makeTemporary(pTVar18);
        return (TIntermNode *)0x0;
      }
      iVar8 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
      cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar8) + 0xf0))
                        ((long *)CONCAT44(extraout_var_09,iVar8));
      if (cVar4 != '\0') {
        iVar8 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
        cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar8) + 0xf8))
                          ((long *)CONCAT44(extraout_var_10,iVar8));
        if (cVar4 != '\0') {
          iVar8 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
          iVar9 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
          iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 0x78))
                            ((long *)CONCAT44(extraout_var_12,iVar9));
          TType::changeOuterArraySize((TType *)CONCAT44(extraout_var_11,iVar8),iVar9);
        }
      }
      iVar8 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
      bVar5 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_13,iVar8));
      this_01 = this;
      if (bVar5) {
        iVar8 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
        bVar5 = TType::isArrayOfArrays((TType *)CONCAT44(extraout_var_14,iVar8));
        if (bVar5) {
          iVar8 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar8) + 0x98))
                             ((long *)CONCAT44(extraout_var_15,iVar8));
          lVar12 = *(long *)(lVar12 + 8);
          iVar8 = 0;
          iVar9 = 0;
          if (lVar12 != 0) {
            iVar9 = (int)((ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8)) >> 4);
          }
          iVar10 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          this = this_01;
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar10) + 0x98))
                             ((long *)CONCAT44(extraout_var_16,iVar10));
          lVar12 = *(long *)(lVar12 + 8);
          if (lVar12 != 0) {
            iVar8 = (int)((ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8)) >> 4);
          }
          this_01 = this;
          if (iVar9 == iVar8) {
            while( true ) {
              iVar8 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
              lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar8) + 0x98))
                                 ((long *)CONCAT44(extraout_var_17,iVar8));
              lVar12 = *(long *)(lVar12 + 8);
              if (lVar12 == 0) {
                iVar8 = 0;
              }
              else {
                iVar8 = (int)((ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8)) >> 4);
              }
              if (iVar8 <= iVar6) break;
              iVar8 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
              pTVar14 = (TSmallArrayVector *)
                        (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar8) + 0x98))
                                  ((long *)CONCAT44(extraout_var_18,iVar8));
              uVar11 = TSmallArrayVector::getDimSize(pTVar14,iVar6);
              if (uVar11 == 0) {
                iVar8 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
                pTVar14 = (TSmallArrayVector *)
                          (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar8) + 0xa0))
                                    ((long *)CONCAT44(extraout_var_19,iVar8));
                iVar8 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
                this_00 = (TSmallArrayVector *)
                          (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar8) + 0x98))
                                    ((long *)CONCAT44(extraout_var_20,iVar8));
                this = this_01;
                uVar11 = TSmallArrayVector::getDimSize(this_00,iVar6);
                this_01 = this;
                TSmallArrayVector::setDimSize(pTVar14,iVar6,uVar11);
              }
              iVar6 = iVar6 + 1;
            }
          }
        }
      }
      if (uVar7 == 5) {
        iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
        lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar6) + 0x58))
                           ((long *)CONCAT44(extraout_var_21,iVar6));
        if ((*(ulong *)(lVar12 + 8) & 0x10000007f) != 2) {
          iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          pTVar15 = (TType *)CONCAT44(extraout_var_22,iVar6);
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          EVar1 = pTVar2->source;
          bVar5 = pTVar2->enhancedMsgs;
          pVar16.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_f0,"",(pool_allocator<char> *)&stack0xfffffffffffffe18);
          pVar17.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_118,"",(pool_allocator<char> *)&stack0xfffffffffffffe10);
          name._M_dataplus._M_p = (pointer)local_118;
          name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_f0;
          name._M_string_length = (size_type)pTVar15;
          name.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe00;
          name.field_2._M_allocated_capacity._4_4_ = uVar7;
          name.field_2._8_8_ = loc;
          structName._M_dataplus._M_p = (pointer)pVar16.allocator;
          structName._M_dataplus.super_allocator_type.allocator = pVar17.allocator;
          structName._M_string_length = (size_type)in_stack_fffffffffffffe20.allocator;
          structName.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe28;
          structName.field_2._8_8_ = in_stack_fffffffffffffe30;
          TType::getCompleteString
                    ((TString *)&stack0xfffffffffffffe20,pTVar15,
                     (bool)(EVar1 == EShSourceGlsl & bVar5),true,true,true,name,structName);
          pp_Var22 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar21 = "uniform initializers must be constant";
LAB_00423ce1:
          (*pp_Var22[0x2d])(this,loc,pcVar21,"=","\'%s\'",in_stack_fffffffffffffe28);
          goto LAB_00424069;
        }
LAB_00423e23:
        pTVar3 = (this->super_TParseContextBase).symbolTable;
        if ((int)((ulong)((long)(pTVar3->table).
                                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar3->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
          iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_27,iVar6) + 0x58))
                             ((long *)CONCAT44(extraout_var_27,iVar6));
          if ((((*(ulong *)(lVar12 + 8) & 0x10000007f) != 2) &&
              ((*(ulong *)(lVar12 + 8) & 0x100000000) == 0)) &&
             ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile)) {
            if ((((this->super_TParseContextBase).super_TParseVersions.messages &
                 EShMsgRelaxedErrors) == EShMsgDefault) ||
               (iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [8])(this,"GL_EXT_shader_non_constant_global_initializers"),
               (char)iVar6 != '\0')) {
              TParseVersions::profileRequires
                        ((TParseVersions *)this,loc,8,0,
                         "GL_EXT_shader_non_constant_global_initializers",
                         "non-constant global initializer (needs GL_EXT_shader_non_constant_global_initializers)"
                        );
            }
            else {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                        (this,loc,"not allowed in this version",
                         "non-constant global initializer (needs GL_EXT_shader_non_constant_global_initializers)"
                         ,"");
            }
          }
        }
        if ((uVar7 != 5) && (uVar7 != 2)) {
LAB_00424098:
          iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
          specializationCheck(this,loc,(TType *)CONCAT44(extraout_var_35,iVar6),"initializer");
          left = TIntermediate::addSymbol
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            variable,loc);
          pTVar19 = TIntermediate::addAssign
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpAssign,&left->super_TIntermTyped,pTVar13,loc);
          if (pTVar19 == (TIntermTyped *)0x0) {
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            TIntermTyped::getCompleteString_abi_cxx11_
                      (&local_190,&left->super_TIntermTyped,
                       (bool)(pTVar2->source == EShSourceGlsl & pTVar2->enhancedMsgs));
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            TIntermTyped::getCompleteString_abi_cxx11_
                      (&local_1b8,pTVar13,
                       (bool)(pTVar2->source == EShSourceGlsl & pTVar2->enhancedMsgs));
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"","=","cannot convert from \'%s\' to \'%s\'",
                       local_1b8._M_dataplus._M_p,local_190._M_dataplus._M_p._0_4_);
            return (TIntermNode *)0x0;
          }
          return &pTVar19->super_TIntermNode;
        }
      }
      else {
        if (uVar7 != 2) goto LAB_00423e23;
        pTVar3 = (this->super_TParseContextBase).symbolTable;
        if ((int)((ulong)((long)(pTVar3->table).
                                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar3->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
          iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar6) + 0x58))
                             ((long *)CONCAT44(extraout_var_24,iVar6));
          if ((*(ulong *)(lVar12 + 8) & 0x100000000) == 0 &&
              (*(ulong *)(lVar12 + 8) & 0x10000007f) != 2) {
            iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
            pTVar15 = (TType *)CONCAT44(extraout_var_28,iVar6);
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            EVar1 = pTVar2->source;
            bVar5 = pTVar2->enhancedMsgs;
            pVar16.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      (local_140,"",(pool_allocator<char> *)&stack0xfffffffffffffe18);
            pVar17.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      (local_168,"",(pool_allocator<char> *)&stack0xfffffffffffffe10);
            name_00._M_dataplus._M_p = (pointer)local_168;
            name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_140;
            name_00._M_string_length = (size_type)pTVar15;
            name_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe00;
            name_00.field_2._M_allocated_capacity._4_4_ = uVar7;
            name_00.field_2._8_8_ = loc;
            structName_00._M_dataplus._M_p = (pointer)pVar16.allocator;
            structName_00._M_dataplus.super_allocator_type.allocator = pVar17.allocator;
            structName_00._M_string_length = (size_type)in_stack_fffffffffffffe20.allocator;
            structName_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe28;
            structName_00.field_2._8_8_ = in_stack_fffffffffffffe30;
            TType::getCompleteString
                      ((TString *)&stack0xfffffffffffffe20,pTVar15,
                       (bool)(EVar1 == EShSourceGlsl & bVar5),true,true,true,name_00,structName_00);
            pp_Var22 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar21 = "global const initializers must be constant";
            goto LAB_00423ce1;
          }
        }
        iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
        lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar6) + 0x58))
                           ((long *)CONCAT44(extraout_var_25,iVar6));
        if ((*(ulong *)(lVar12 + 8) & 0x100000000) == 0 &&
            (*(ulong *)(lVar12 + 8) & 0x10000007f) != 2) {
          this = this_01;
          TParseVersions::requireProfile
                    ((TParseVersions *)this_01,loc,-9,"non-constant initializer");
          TParseVersions::profileRequires
                    ((TParseVersions *)this,loc,-9,0x1a4,"GL_ARB_shading_language_420pack",
                     "non-constant initializer");
          iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
          lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar6) + 0x50))
                             ((long *)CONCAT44(extraout_var_26,iVar6));
          *(ulong *)(lVar12 + 8) = *(ulong *)(lVar12 + 8) & 0xffffffffffffff80 | 0x13;
          goto LAB_00424098;
        }
      }
      pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pTVar13 = TIntermediate::addConversion
                          (pTVar2,EOpAssign,(TType *)CONCAT44(extraout_var_29,iVar6),pTVar13);
      if (pTVar13 != (TIntermTyped *)0x0) {
        iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
        lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar6) + 0x58))
                           ((long *)CONCAT44(extraout_var_30,iVar6));
        if ((*(ulong *)(lVar12 + 8) & 0x10000007f) == 2 ||
            (*(ulong *)(lVar12 + 8) & 0x100000000) != 0) {
          iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          iVar8 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
          bVar5 = TType::operator!=((TType *)CONCAT44(extraout_var_31,iVar6),
                                    (TType *)CONCAT44(extraout_var_32,iVar8));
          if (!bVar5) {
            iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[5])(pTVar13);
            if (CONCAT44(extraout_var_36,iVar6) == 0) {
              iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar13);
              lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_37,iVar6) + 0x58))
                                 ((long *)CONCAT44(extraout_var_37,iVar6));
              if ((*(ulong *)(lVar12 + 8) & 0x100000000) == 0) {
                __assert_fail("initializer->getAsConstantUnion() || initializer->getType().getQualifier().isSpecConstant()"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                              ,0x21a2,
                              "TIntermNode *glslang::TParseContext::executeInitializer(const TSourceLoc &, TIntermTyped *, TVariable *)"
                             );
              }
            }
            iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[5])(pTVar13);
            if (CONCAT44(extraout_var_38,iVar6) != 0) {
              iVar6 = (*(pTVar13->super_TIntermNode)._vptr_TIntermNode[5])(pTVar13);
              (*(variable->super_TSymbol)._vptr_TSymbol[0x19])
                        (variable,CONCAT44(extraout_var_39,iVar6) + 0xb8);
              return (TIntermNode *)0x0;
            }
            iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
            lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_40,iVar6) + 0x50))
                               ((long *)CONCAT44(extraout_var_40,iVar6));
            *(ulong *)(lVar12 + 8) = (*(ulong *)(lVar12 + 8) & 0xfffffffeffffff80) + 0x100000002;
            (*(variable->super_TSymbol)._vptr_TSymbol[0x1a])(variable,pTVar13);
            return (TIntermNode *)0x0;
          }
        }
      }
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pcVar21 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_33,iVar6));
      (*(this_01->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this_01,loc,"non-matching or non-convertible constant type for const initializer",
                 pcVar21,"");
LAB_00424069:
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      pTVar18 = (TQualifier *)
                (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar6) + 0x50))
                          ((long *)CONCAT44(extraout_var_34,iVar6));
      TQualifier::makeTemporary(pTVar18);
      return (TIntermNode *)0x0;
    }
  }
  else {
    if (uVar7 != 7) {
      if (((uVar7 != 5) ||
          ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile)) ||
         ((this->super_TParseContextBase).super_TParseVersions.version < 0x78)) {
        iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
        pcVar21 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_03,iVar6));
        pp_Var22 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar20 = " cannot initialize this type of qualifier ";
        goto LAB_00423957;
      }
      goto LAB_00423853;
    }
    if (!bVar5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"initializer can only be a null initializer (\'{}\')","shared");
      goto LAB_004239ac;
    }
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,8,0,"GL_EXT_null_initializer",
               "initialization with shared qualifier");
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,-9,0,"GL_EXT_null_initializer",
               "initialization with shared qualifier");
  }
  iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x1a8))
                    ((long *)CONCAT44(extraout_var_04,iVar6));
  if (cVar4 == '\0') {
    iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x1b0))
                      ((long *)CONCAT44(extraout_var_05,iVar6));
    if (cVar4 == '\0') {
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x50))
                         ((long *)CONCAT44(extraout_var_06,iVar6));
      *(byte *)(lVar12 + 0xf) = *(byte *)(lVar12 + 0xf) | 4;
      return (TIntermNode *)0x0;
    }
    pp_Var22 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar20 = "null initializers can\'t be used on opaque values";
  }
  else {
    pp_Var22 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar20 = "null initializers can\'t size unsized arrays";
  }
  pcVar21 = "{}";
LAB_00423957:
  (*pp_Var22[0x2d])(this,loc,pcVar20,pcVar21,"");
  return (TIntermNode *)0x0;
}

Assistant:

TIntermNode* TParseContext::executeInitializer(const TSourceLoc& loc, TIntermTyped* initializer, TVariable* variable)
{
    // A null initializer is an aggregate that hasn't had an op assigned yet
    // (still EOpNull, no relation to nullInit), and has no children.
    bool nullInit = initializer->getAsAggregate() && initializer->getAsAggregate()->getOp() == EOpNull &&
        initializer->getAsAggregate()->getSequence().size() == 0;

    //
    // Identifier must be of type constant, a global, or a temporary, and
    // starting at version 120, desktop allows uniforms to have initializers.
    //
    TStorageQualifier qualifier = variable->getType().getQualifier().storage;
    if (! (qualifier == EvqTemporary || qualifier == EvqGlobal || qualifier == EvqConst ||
           (qualifier == EvqUniform && !isEsProfile() && version >= 120))) {
        if (qualifier == EvqShared) {
            // GL_EXT_null_initializer allows this for shared, if it's a null initializer
            if (nullInit) {
                const char* feature = "initialization with shared qualifier";
                profileRequires(loc, EEsProfile, 0, E_GL_EXT_null_initializer, feature);
                profileRequires(loc, ~EEsProfile, 0, E_GL_EXT_null_initializer, feature);
            } else {
                error(loc, "initializer can only be a null initializer ('{}')", "shared", "");
            }
        } else {
            error(loc, " cannot initialize this type of qualifier ",
                  variable->getType().getStorageQualifierString(), "");
            return nullptr;
        }
    }

    if (nullInit) {
        // only some types can be null initialized
        if (variable->getType().containsUnsizedArray()) {
            error(loc, "null initializers can't size unsized arrays", "{}", "");
            return nullptr;
        }
        if (variable->getType().containsOpaque()) {
            error(loc, "null initializers can't be used on opaque values", "{}", "");
            return nullptr;
        }
        variable->getWritableType().getQualifier().setNullInit();
        return nullptr;
    }

    arrayObjectCheck(loc, variable->getType(), "array initializer");

    //
    // If the initializer was from braces { ... }, we convert the whole subtree to a
    // constructor-style subtree, allowing the rest of the code to operate
    // identically for both kinds of initializers.
    //
    // Type can't be deduced from the initializer list, so a skeletal type to
    // follow has to be passed in.  Constness and specialization-constness
    // should be deduced bottom up, not dictated by the skeletal type.
    //
    TType skeletalType;
    skeletalType.shallowCopy(variable->getType());
    skeletalType.getQualifier().makeTemporary();
    initializer = convertInitializerList(loc, skeletalType, initializer);
    if (! initializer) {
        // error recovery; don't leave const without constant values
        if (qualifier == EvqConst)
            variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }

    // Fix outer arrayness if variable is unsized, getting size from the initializer
    if (initializer->getType().isSizedArray() && variable->getType().isUnsizedArray())
        variable->getWritableType().changeOuterArraySize(initializer->getType().getOuterArraySize());

    // Inner arrayness can also get set by an initializer
    if (initializer->getType().isArrayOfArrays() && variable->getType().isArrayOfArrays() &&
        initializer->getType().getArraySizes()->getNumDims() ==
           variable->getType().getArraySizes()->getNumDims()) {
        // adopt unsized sizes from the initializer's sizes
        for (int d = 1; d < variable->getType().getArraySizes()->getNumDims(); ++d) {
            if (variable->getType().getArraySizes()->getDimSize(d) == UnsizedArraySize) {
                variable->getWritableType().getArraySizes()->setDimSize(d,
                    initializer->getType().getArraySizes()->getDimSize(d));
            }
        }
    }

    // Uniforms require a compile-time constant initializer
    if (qualifier == EvqUniform && ! initializer->getType().getQualifier().isFrontEndConstant()) {
        error(loc, "uniform initializers must be constant", "=", "'%s'",
              variable->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }
    // Global consts require a constant initializer (specialization constant is okay)
    if (qualifier == EvqConst && symbolTable.atGlobalLevel() && ! initializer->getType().getQualifier().isConstant()) {
        error(loc, "global const initializers must be constant", "=", "'%s'",
              variable->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }

    // Const variables require a constant initializer, depending on version
    if (qualifier == EvqConst) {
        if (! initializer->getType().getQualifier().isConstant()) {
            const char* initFeature = "non-constant initializer";
            requireProfile(loc, ~EEsProfile, initFeature);
            profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, initFeature);
            variable->getWritableType().getQualifier().storage = EvqConstReadOnly;
            qualifier = EvqConstReadOnly;
        }
    } else {
        // Non-const global variables in ES need a const initializer.
        //
        // "In declarations of global variables with no storage qualifier or with a const
        // qualifier any initializer must be a constant expression."
        if (symbolTable.atGlobalLevel() && ! initializer->getType().getQualifier().isConstant()) {
            const char* initFeature =
                "non-constant global initializer (needs GL_EXT_shader_non_constant_global_initializers)";
            if (isEsProfile()) {
                if (relaxedErrors() && ! extensionTurnedOn(E_GL_EXT_shader_non_constant_global_initializers))
                    warn(loc, "not allowed in this version", initFeature, "");
                else
                    profileRequires(loc, EEsProfile, 0, E_GL_EXT_shader_non_constant_global_initializers, initFeature);
            }
        }
    }

    if (qualifier == EvqConst || qualifier == EvqUniform) {
        // Compile-time tagging of the variable with its constant value...

        initializer = intermediate.addConversion(EOpAssign, variable->getType(), initializer);
        if (! initializer || ! initializer->getType().getQualifier().isConstant() ||
            variable->getType() != initializer->getType()) {
            error(loc, "non-matching or non-convertible constant type for const initializer",
                  variable->getType().getStorageQualifierString(), "");
            variable->getWritableType().getQualifier().makeTemporary();
            return nullptr;
        }

        // We either have a folded constant in getAsConstantUnion, or we have to use
        // the initializer's subtree in the AST to represent the computation of a
        // specialization constant.
        assert(initializer->getAsConstantUnion() || initializer->getType().getQualifier().isSpecConstant());
        if (initializer->getAsConstantUnion())
            variable->setConstArray(initializer->getAsConstantUnion()->getConstArray());
        else {
            // It's a specialization constant.
            variable->getWritableType().getQualifier().makeSpecConstant();

            // Keep the subtree that computes the specialization constant with the variable.
            // Later, a symbol node will adopt the subtree from the variable.
            variable->setConstSubtree(initializer);
        }
    } else {
        // normal assigning of a value to a variable...
        specializationCheck(loc, initializer->getType(), "initializer");
        TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
        TIntermTyped* initNode = intermediate.addAssign(EOpAssign, intermSymbol, initializer, loc);
        if (! initNode)
            assignError(loc, "=", intermSymbol->getCompleteString(intermediate.getEnhancedMsgs()), initializer->getCompleteString(intermediate.getEnhancedMsgs()));

        return initNode;
    }

    return nullptr;
}